

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_UInt32 UA_NodeId_hash(UA_NodeId *n)

{
  UA_NodeIdType UVar1;
  size_t sVar2;
  uint uVar3;
  size_t i;
  long lVar4;
  size_t sVar5;
  
  UVar1 = n->identifierType;
  if (UVar1 != UA_NODEIDTYPE_STRING) {
    if (UVar1 == UA_NODEIDTYPE_GUID) {
      uVar3 = (uint)n->namespaceIndex;
      lVar4 = 0;
      do {
        uVar3 = (*(byte *)((long)&n->identifier + lVar4) ^ uVar3) * 0x1000193;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x10);
      return uVar3;
    }
    if (UVar1 != UA_NODEIDTYPE_BYTESTRING) {
      return (n->identifier).numeric * -0x61c8864f + (uint)n->namespaceIndex;
    }
  }
  uVar3 = (uint)n->namespaceIndex;
  sVar2 = (n->identifier).string.length;
  if (sVar2 == 0) {
    return uVar3;
  }
  sVar5 = 0;
  do {
    uVar3 = ((n->identifier).string.data[sVar5] ^ uVar3) * 0x1000193;
    sVar5 = sVar5 + 1;
  } while (sVar2 != sVar5);
  return uVar3;
}

Assistant:

UA_UInt32
UA_NodeId_hash(const UA_NodeId *n) {
    switch(n->identifierType) {
    case UA_NODEIDTYPE_NUMERIC:
    default:
        return (UA_UInt32)(n->namespaceIndex + (n->identifier.numeric * 2654435761)); /*  Knuth's multiplicative hashing */
    case UA_NODEIDTYPE_STRING:
    case UA_NODEIDTYPE_BYTESTRING:
        return fnv32(n->namespaceIndex, n->identifier.string.data, n->identifier.string.length);
    case UA_NODEIDTYPE_GUID:
        return fnv32(n->namespaceIndex, (const UA_Byte*)&n->identifier.guid, sizeof(UA_Guid));
    }
}